

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

LoopStatementSyntax * __thiscall
slang::parsing::Parser::parseLoopStatement(Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  ExpressionSyntax *expr;
  undefined8 uVar1;
  StatementSyntax *statement;
  LoopStatementSyntax *pLVar2;
  __extent_storage<18446744073709551615UL> _Var3;
  __extent_storage<18446744073709551615UL> _Var4;
  char *pcVar5;
  bool bVar6;
  string_view syntaxName;
  Token repeatOrWhile;
  Token openParen;
  Token closeParen;
  Token prevToken;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  _Var3 = attributes._M_extent._M_extent_value;
  _Var4._M_extent_value = _Var3._M_extent_value;
  repeatOrWhile = ParserBase::consume(&this->super_ParserBase);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  expr = parseExpression(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  uVar1 = closeParen._0_8_;
  statement = parseStatement(this,true,false);
  bVar6 = repeatOrWhile.kind == WhileKeyword;
  pcVar5 = "repeat loop";
  if (bVar6) {
    pcVar5 = "while loop";
  }
  syntaxName._M_len = (ulong)bVar6 ^ 0xb;
  syntaxName._M_str = pcVar5;
  prevToken.info = (Info *)_Var4._M_extent_value;
  prevToken.kind = (short)uVar1;
  prevToken._2_1_ = (char)((ulong)uVar1 >> 0x10);
  prevToken.numFlags.raw = (char)((ulong)uVar1 >> 0x18);
  prevToken.rawLen = (int)((ulong)uVar1 >> 0x20);
  checkEmptyBody(this,&statement->super_SyntaxNode,prevToken,syntaxName);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002da628;
  local_68.super_SyntaxListBase.childCount = _Var3._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = _Var3._M_extent_value;
  pLVar2 = syntax::SyntaxFactory::loopStatement
                     (&this->factory,label,&local_68,repeatOrWhile,openParen,expr,closeParen,
                      statement);
  return pLVar2;
}

Assistant:

LoopStatementSyntax& Parser::parseLoopStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& statement = parseStatement();
    checkEmptyBody(statement, closeParen,
                   keyword.kind == TokenKind::WhileKeyword ? "while loop"sv : "repeat loop"sv);
    return factory.loopStatement(label, attributes, keyword, openParen, expr, closeParen,
                                 statement);
}